

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

int Gia_ManLutLevelWithBoxes_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint Fill;
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int Fill_00;
  long lVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
    uVar10 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= (int)uVar10) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar9 = 0;
    if (p->pTravIds[(int)uVar10] != p->nTravIds) {
      p->pTravIds[(int)uVar10] = p->nTravIds;
      uVar5 = (uint)*(undefined8 *)pObj;
      iVar9 = 1;
      if ((~uVar5 & 0x9fffffff) != 0) {
        if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                        ,0x23a,"int Gia_ManLutLevelWithBoxes_rec(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (pObj < pGVar2 + p->nObjs) {
          if (-1 < (int)uVar10) {
            pVVar6 = p->vMapping;
            uVar5 = pVVar6->nSize;
            if ((int)uVar10 < (int)uVar5) {
              iVar9 = 0;
              lVar8 = 0;
              do {
                piVar3 = pVVar6->pArray;
                Fill = piVar3[uVar10 & 0x7fffffff];
                lVar7 = (long)(int)Fill;
                if ((lVar7 < 0) || (uVar5 <= Fill)) break;
                if (piVar3[lVar7] <= lVar8) {
                  pVVar6 = p->vLevels;
                  Vec_IntFillExtra(pVVar6,uVar10 + 1,Fill);
                  if ((int)uVar10 < pVVar6->nSize) {
                    pVVar6->pArray[uVar10 & 0x7fffffff] = iVar9 + 1;
                    return 0;
                  }
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                iVar1 = piVar3[lVar7 + lVar8 + 1];
                lVar7 = (long)iVar1;
                if ((lVar7 < 0) || (p->nObjs <= iVar1)) {
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                }
                iVar4 = Gia_ManLutLevelWithBoxes_rec(p,p->pObjs + lVar7);
                if (iVar4 != 0) {
                  return 1;
                }
                pVVar6 = p->vLevels;
                Vec_IntFillExtra(pVVar6,iVar1 + 1,Fill_00);
                if (pVVar6->nSize <= iVar1) break;
                if (iVar9 <= pVVar6->pArray[lVar7]) {
                  iVar9 = pVVar6->pArray[lVar7];
                }
                lVar8 = lVar8 + 1;
                pVVar6 = p->vMapping;
                uVar5 = pVVar6->nSize;
              } while ((int)uVar10 < (int)uVar5);
            }
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        goto LAB_00234303;
      }
    }
    return iVar9;
  }
LAB_00234303:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_ManLutLevelWithBoxes_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int iObj, k, iFan, Level = 0;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 1;
    assert( Gia_ObjIsAnd(pObj) );
    iObj = Gia_ObjId( p, pObj );
    Gia_LutForEachFanin( p, iObj, iFan, k )
    {
        if ( Gia_ManLutLevelWithBoxes_rec( p, Gia_ManObj(p, iFan) ) )
            return 1;
        Level = Abc_MaxInt( Level, Gia_ObjLevelId(p, iFan) );
    }
    Gia_ObjSetLevelId( p, iObj, Level + 1 );
    return 0;
}